

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result __thiscall
testing::internal::FunctionMocker<solitaire::interfaces::Button_&()>::Invoke
          (FunctionMocker<solitaire::interfaces::Button_&()> *this)

{
  UntypedActionResultHolderBase *f;
  ActionResultHolder<solitaire::interfaces::Button_&> *__p;
  pointer this_00;
  Button *pBVar1;
  unique_ptr<testing::internal::ActionResultHolder<solitaire::interfaces::Button_&>,_std::default_delete<testing::internal::ActionResultHolder<solitaire::interfaces::Button_&>_>_>
  local_20;
  unique_ptr<testing::internal::ActionResultHolder<solitaire::interfaces::Button_&>,_std::default_delete<testing::internal::ActionResultHolder<solitaire::interfaces::Button_&>_>_>
  holder;
  ArgumentTuple tuple;
  FunctionMocker<solitaire::interfaces::Button_&()> *this_local;
  
  holder._M_t.
  super___uniq_ptr_impl<testing::internal::ActionResultHolder<solitaire::interfaces::Button_&>,_std::default_delete<testing::internal::ActionResultHolder<solitaire::interfaces::Button_&>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ActionResultHolder<solitaire::interfaces::Button_&>_*,_std::default_delete<testing::internal::ActionResultHolder<solitaire::interfaces::Button_&>_>_>
  .
  super__Head_base<0UL,_testing::internal::ActionResultHolder<solitaire::interfaces::Button_&>_*,_false>
  ._M_head_impl._7_1_ = 0;
  f = UntypedFunctionMockerBase::UntypedInvokeWith
                (&this->super_UntypedFunctionMockerBase,
                 (void *)((long)&holder._M_t.
                                 super___uniq_ptr_impl<testing::internal::ActionResultHolder<solitaire::interfaces::Button_&>,_std::default_delete<testing::internal::ActionResultHolder<solitaire::interfaces::Button_&>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_testing::internal::ActionResultHolder<solitaire::interfaces::Button_&>_*,_std::default_delete<testing::internal::ActionResultHolder<solitaire::interfaces::Button_&>_>_>
                                 .
                                 super__Head_base<0UL,_testing::internal::ActionResultHolder<solitaire::interfaces::Button_&>_*,_false>
                                 ._M_head_impl + 7));
  __p = DownCast_<testing::internal::ActionResultHolder<solitaire::interfaces::Button&>*,testing::internal::UntypedActionResultHolderBase>
                  (f);
  std::
  unique_ptr<testing::internal::ActionResultHolder<solitaire::interfaces::Button&>,std::default_delete<testing::internal::ActionResultHolder<solitaire::interfaces::Button&>>>
  ::
  unique_ptr<std::default_delete<testing::internal::ActionResultHolder<solitaire::interfaces::Button&>>,void>
            ((unique_ptr<testing::internal::ActionResultHolder<solitaire::interfaces::Button&>,std::default_delete<testing::internal::ActionResultHolder<solitaire::interfaces::Button&>>>
              *)&local_20,__p);
  this_00 = std::
            unique_ptr<testing::internal::ActionResultHolder<solitaire::interfaces::Button_&>,_std::default_delete<testing::internal::ActionResultHolder<solitaire::interfaces::Button_&>_>_>
            ::operator->(&local_20);
  pBVar1 = ActionResultHolder<solitaire::interfaces::Button_&>::Unwrap(this_00);
  std::
  unique_ptr<testing::internal::ActionResultHolder<solitaire::interfaces::Button_&>,_std::default_delete<testing::internal::ActionResultHolder<solitaire::interfaces::Button_&>_>_>
  ::~unique_ptr(&local_20);
  return pBVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }